

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void __thiscall PKCS12Test_TestPBES2_Test::TestBody(PKCS12Test_TestPBES2_Test *this)

{
  undefined1 auVar1 [16];
  Span<const_unsigned_char> der;
  string_view s;
  string_view s_00;
  string local_80;
  undefined1 local_50 [16];
  Span<const_unsigned_char> local_40;
  undefined1 local_30 [8];
  string data;
  PKCS12Test_TestPBES2_Test *this_local;
  
  data.field_2._8_8_ = this;
  GetTestData_abi_cxx11_((string *)local_30,"crypto/pkcs8/test/pbes2_sha1.p12");
  local_50 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  s._M_str = local_50._8_8_;
  s._M_len = (size_t)s._M_str;
  local_40 = bssl::StringAsBytes(local_50._0_8_,s);
  TestImpl("kPBES2WithSHA1",local_40,"foo",(char *)0x0);
  GetTestData_abi_cxx11_(&local_80,"crypto/pkcs8/test/pbes2_sha256.p12");
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  s_00._M_str = auVar1._8_8_;
  s_00._M_len = (size_t)s_00._M_str;
  der = bssl::StringAsBytes(auVar1._0_8_,s_00);
  TestImpl("kPBES2WithSHA256",der,"foo",(char *)0x0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(PKCS12Test, TestPBES2) {
  // pbes2_sha1.p12 is a PKCS#12 file using PBES2 and HMAC-SHA-1 created with:
  // openssl pkcs12 -export -inkey key.pem -in cert.pem -keypbe AES-128-CBC
  // -certpbe AES-128-CBC
  //
  // This was generated with an older OpenSSL, which used hmacWithSHA1 as the
  // PRF. (There is currently no way to specify the PRF in the pkcs12 command.)
  std::string data = GetTestData("crypto/pkcs8/test/pbes2_sha1.p12");
  TestImpl("kPBES2WithSHA1", bssl::StringAsBytes(data), kPassword, nullptr);

  // pbes2_sha256.p12 is a PKCS#12 file using PBES2 and HMAC-SHA-256. It was
  // generated in the same way as pbes2_sha1.p12, but using OpenSSL 1.1.1b,
  // which uses hmacWithSHA256 as the PRF.
  data = GetTestData("crypto/pkcs8/test/pbes2_sha256.p12");
  TestImpl("kPBES2WithSHA256", bssl::StringAsBytes(data), kPassword, nullptr);
}